

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_handler.cpp
# Opt level: O3

spv_result_t __thiscall
spvtools::AssemblyContext::recordIdAsExtInstImport
          (AssemblyContext *this,uint32_t id,spv_ext_inst_type_t type)

{
  spv_result_t sVar1;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_int,_spv_ext_inst_type_t>,_false,_false>,_bool>
  pVar2;
  DiagnosticStream local_1f0;
  
  local_1f0._4_4_ = type;
  local_1f0._0_4_ = id;
  pVar2 = std::
          _Hashtable<unsigned_int,std::pair<unsigned_int_const,spv_ext_inst_type_t>,std::allocator<std::pair<unsigned_int_const,spv_ext_inst_type_t>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_emplace<std::pair<unsigned_int,spv_ext_inst_type_t>>
                    ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,spv_ext_inst_type_t>,std::allocator<std::pair<unsigned_int_const,spv_ext_inst_type_t>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)&this->import_id_to_ext_inst_type_);
  sVar1 = SPV_SUCCESS;
  if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    diagnostic(&local_1f0,this,SPV_ERROR_INVALID_TEXT);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1f0,"Import Id is being defined a second time",0x28);
    DiagnosticStream::~DiagnosticStream(&local_1f0);
    sVar1 = local_1f0.error_;
  }
  return sVar1;
}

Assistant:

spv_result_t AssemblyContext::recordIdAsExtInstImport(
    uint32_t id, spv_ext_inst_type_t type) {
  bool successfully_inserted = false;
  std::tie(std::ignore, successfully_inserted) =
      import_id_to_ext_inst_type_.insert(std::make_pair(id, type));
  if (!successfully_inserted)
    return diagnostic() << "Import Id is being defined a second time";
  return SPV_SUCCESS;
}